

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setprop.c
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  
  if (argc == 3) {
    iVar1 = property_set(argv[1],argv[2]);
    if (iVar1 == 0) {
      return 0;
    }
    main_cold_2();
  }
  else {
    main_cold_1();
  }
  return 1;
}

Assistant:

int main(int argc, char *argv[])
{
    if(argc != 3) {
        fprintf(stderr,"usage: setprop <key> <value>\n");
        return 1;
    }

    if(property_set(argv[1], argv[2])){
        fprintf(stderr,"could not set property\n");
        return 1;
    }

    return 0;
}